

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmTarget *this_00;
  cmake *this_01;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  cmListFileBacktrace *bt;
  PolicyID id;
  cmTarget *this_02;
  ostringstream e;
  MessageType local_228;
  undefined1 local_218 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_1f8;
  PositionType local_1f0;
  string local_1e0;
  Snapshot local_1c0;
  undefined1 local_1a8 [376];
  
  this_02 = dependee_name->Target;
  if ((this_02 != (cmTarget *)0x0 || linking) ||
     (this_00 = (this->Targets).
                super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_start[depender_index],
     this_00->TargetTypeValue == GLOBAL_TARGET)) goto LAB_003601e4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  PVar2 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0046);
  if (PVar2 - NEW < 3) {
    local_228 = FATAL_ERROR;
LAB_0036000c:
    bVar1 = true;
  }
  else {
    local_228 = AUTHOR_WARNING;
    if (PVar2 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_218,(cmPolicies *)0x2e,id);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_218._0_8_,local_218._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      goto LAB_0036000c;
    }
    bVar1 = false;
  }
  if (bVar1) {
    this_01 = this->GlobalGenerator->CMakeInstance;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The dependency target \"",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(dependee_name->super_string)._M_dataplus._M_p,
                        (dependee_name->super_string)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" of target \"",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this_00->Name)._M_dataplus._M_p,(this_00->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" does not exist.",0x11);
    bt = cmTarget::GetUtilityBacktrace(this_00,&dependee_name->super_string);
    if (bt == (cmListFileBacktrace *)0x0) {
      std::__cxx11::stringbuf::str();
      cmState::Snapshot::Snapshot(&local_1c0,(cmState *)0x0,(PositionType)ZEXT816(0));
      local_1f0 = local_1c0.Position.Position;
      local_218._24_8_ = local_1c0.State;
      pcStack_1f8 = local_1c0.Position.Tree;
      local_218._0_8_ = (char *)0x0;
      local_218._8_8_ = (pointer)0x0;
      local_218._16_8_ = 0;
      cmake::IssueMessage(this_01,local_228,&local_1e0,(cmListFileBacktrace *)local_218);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_003601b7;
    }
    else {
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,local_228,(string *)local_218,bt);
      local_1e0.field_2._M_allocated_capacity = local_218._16_8_;
      local_1e0._M_dataplus._M_p = (pointer)local_218._0_8_;
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
LAB_003601b7:
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_003601e4:
  if (((linking && this_02 != (cmTarget *)0x0) && (this_02->TargetTypeValue == EXECUTABLE)) &&
     (bVar1 = cmTarget::IsExecutableWithExports(this_02), !bVar1)) {
    this_02 = (cmTarget *)0x0;
  }
  if (this_02 != (cmTarget *)0x0) {
    AddTargetDepend(this,depender_index,this_02,linking);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmLinkItem const& dependee_name,
  bool linking)
{
  // Get the depender.
  cmTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmTarget const* dependee = dependee_name.Target;

  if(!dependee && !linking &&
    (depender->GetType() != cmTarget::GLOBAL_TARGET))
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch(depender->GetPolicyStatusCMP0046())
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if(issueMessage)
      {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" <<  dependee_name
        << "\" of target \"" << depender->GetName() << "\" does not exist.";

      cmListFileBacktrace const* backtrace =
        depender->GetUtilityBacktrace(dependee_name);
      if(backtrace)
        {
        cm->IssueMessage(messageType, e.str(), *backtrace);
        }
      else
        {
        cm->IssueMessage(messageType, e.str());
        }

      }
    }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(linking && dependee &&
     dependee->GetType() == cmTarget::EXECUTABLE &&
     !dependee->IsExecutableWithExports())
    {
    dependee = 0;
    }

  if(dependee)
    {
    this->AddTargetDepend(depender_index, dependee, linking);
    }
}